

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

int4 __thiscall Datatype::compareDependency(Datatype *this,Datatype *op)

{
  uint uVar1;
  uint uVar2;
  uint4 opfl;
  uint4 fl;
  Datatype *op_local;
  Datatype *this_local;
  
  if (this->size == op->size) {
    if (this->metatype == op->metatype) {
      uVar1 = this->flags & 0xfffffffe ^ 2;
      uVar2 = op->flags & 0xfffffffe ^ 2;
      if (uVar1 == uVar2) {
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ = 1;
        if (uVar2 < uVar1) {
          this_local._4_4_ = -1;
        }
      }
    }
    else {
      this_local._4_4_ = 1;
      if ((int)this->metatype < (int)op->metatype) {
        this_local._4_4_ = -1;
      }
    }
  }
  else {
    this_local._4_4_ = op->size - this->size;
  }
  return this_local._4_4_;
}

Assistant:

int4 Datatype::compareDependency(const Datatype &op) const

{
  if (size != op.size) return (op.size-size);
  if (metatype != op.metatype) return (metatype < op.metatype) ? -1 : 1;
  uint4 fl = flags & (~coretype);
  uint4 opfl = op.flags & (~coretype);
  // We need to be careful here, we compare flags so that enum types are more specific than base int or uint,
  // we also want UTF16 and UTF32 to be more specific than int, BUT
  // we don't want char to be more specific than int1 because char is the default size 1 integer type.
  fl ^= chartype;
  opfl ^= chartype;
  if (fl != opfl) return (opfl < fl) ? -1 : 1;
  return 0;
}